

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

thanm_instr_t * thanm_instr_new_raw(anm_instr_t *raw_instr,char *format)

{
  byte type;
  thanm_instr_t *ptVar1;
  value_t *value;
  ssize_t sVar2;
  int *data;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  ptVar1 = (thanm_instr_t *)util_malloc(0x28);
  list_init(&ptVar1->params);
  ptVar1->type = 0;
  ptVar1->time = raw_instr->time;
  ptVar1->id = raw_instr->type;
  ptVar1->size = (uint)raw_instr->length;
  ptVar1->param_mask = raw_instr->param_mask;
  uVar4 = (ulong)raw_instr->length - 8;
  if (uVar4 != 0) {
    uVar5 = 0;
    lVar6 = 0;
    do {
      value = (value_t *)malloc(0x18);
      if (format == (char *)0x0) {
        iVar3 = 0x53;
LAB_0010ff32:
        type = 0x53;
      }
      else {
        type = format[lVar6];
        iVar3 = (int)(char)type;
        if ((type - 0x4e < 0x27) && ((0x4300000001U >> ((ulong)(type - 0x4e) & 0x3f) & 1) != 0))
        goto LAB_0010ff32;
      }
      sVar2 = value_from_data((uchar *)((long)&raw_instr[1].type + uVar5),uVar4 - uVar5,type,value);
      if (sVar2 == -1) {
        fprintf(_stderr,
                "%s: value read error in ins_%d:\ndata length = %zd, offset = %d, format = %s\n",
                argv0,(ulong)raw_instr->type,(ulong)raw_instr->length - 8,uVar5 & 0xffffffff,format)
        ;
        abort();
      }
      data = (int *)util_malloc(0x18);
      data[1] = 0;
      *data = iVar3;
      data[2] = 0;
      data[3] = 0;
      data[4] = 0;
      data[5] = 0;
      if ((raw_instr->param_mask >> ((uint)lVar6 & 0x1f) & 1) != 0) {
        data[1] = 1;
      }
      uVar5 = uVar5 + sVar2;
      *(value_t **)(data + 4) = value;
      list_append_new(&ptVar1->params,data);
      lVar6 = lVar6 + 1;
      uVar4 = (ulong)raw_instr->length - 8;
    } while (uVar5 < uVar4);
  }
  return ptVar1;
}

Assistant:

static thanm_instr_t*
thanm_instr_new_raw(
    anm_instr_t* raw_instr,
    const char* format
) {
    thanm_instr_t* ret = thanm_instr_new();
    ret->type = THANM_INSTR_INSTR;
    ret->time = raw_instr->time;
    ret->id = raw_instr->type;
    ret->size = raw_instr->length;
    ret->param_mask = raw_instr->param_mask;
    thanm_make_params(raw_instr, &ret->params, format);
    return ret;
}